

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_folding_rules.h
# Opt level: O1

vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
* __thiscall
spvtools::opt::ConstantFoldingRules::GetRulesForInstruction
          (ConstantFoldingRules *this,Instruction *inst)

{
  Op OVar1;
  ulong uVar2;
  uint32_t index;
  const_iterator cVar3;
  _Hash_node_base *p_Var4;
  ulong uVar5;
  uint uVar6;
  __node_base_ptr p_Var7;
  __node_base_ptr p_Var8;
  key_type local_20;
  
  OVar1 = inst->opcode_;
  if ((ulong)OVar1 == 0xc) {
    index = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      index = (uint)inst->has_result_id_;
    }
    local_20.instruction_set = Instruction::GetSingleWordOperand(inst,index);
    uVar6 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar6 = (uint)inst->has_result_id_;
    }
    local_20.opcode = Instruction::GetSingleWordOperand(inst,uVar6 + 1);
    cVar3 = std::
            _Rb_tree<spvtools::opt::ConstantFoldingRules::Key,_std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>,_std::_Select1st<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
            ::find(&(this->ext_rules_)._M_t,&local_20);
    if ((_Rb_tree_header *)cVar3._M_node != &(this->ext_rules_)._M_t._M_impl.super__Rb_tree_header)
    {
      return (vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
              *)&cVar3._M_node[1]._M_parent;
    }
  }
  else {
    uVar2 = (this->rules_)._M_h._M_bucket_count;
    uVar5 = (ulong)OVar1 % uVar2;
    p_Var7 = (this->rules_)._M_h._M_buckets[uVar5];
    p_Var8 = (__node_base_ptr)0x0;
    if ((p_Var7 != (__node_base_ptr)0x0) &&
       (p_Var4 = p_Var7->_M_nxt, p_Var8 = p_Var7, OVar1 != *(Op *)&p_Var7->_M_nxt[1]._M_nxt)) {
      while (p_Var7 = p_Var4, p_Var4 = p_Var7->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
        p_Var8 = (__node_base_ptr)0x0;
        if (((ulong)*(Op *)&p_Var4[1]._M_nxt % uVar2 != uVar5) ||
           (p_Var8 = p_Var7, OVar1 == *(Op *)&p_Var4[1]._M_nxt)) goto LAB_0020b90d;
      }
      p_Var8 = (__node_base_ptr)0x0;
    }
LAB_0020b90d:
    if (p_Var8 == (__node_base_ptr)0x0) {
      p_Var4 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var4 = p_Var8->_M_nxt;
    }
    if (p_Var4 != (_Hash_node_base *)0x0) {
      return (vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
              *)(p_Var4 + 2);
    }
  }
  return &this->empty_vector_;
}

Assistant:

const std::vector<ConstantFoldingRule>& GetRulesForInstruction(
      const Instruction* inst) const {
    if (inst->opcode() != spv::Op::OpExtInst) {
      auto it = rules_.find(inst->opcode());
      if (it != rules_.end()) {
        return it->second.value;
      }
    } else {
      uint32_t ext_inst_id = inst->GetSingleWordInOperand(0);
      uint32_t ext_opcode = inst->GetSingleWordInOperand(1);
      auto it = ext_rules_.find({ext_inst_id, ext_opcode});
      if (it != ext_rules_.end()) {
        return it->second.value;
      }
    }
    return empty_vector_;
  }